

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

ON_LineCurve * __thiscall ON_Extrusion::PathLineCurve(ON_Extrusion *this,ON_LineCurve *line_curve)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  ON_LineCurve *this_00;
  double *pdVar5;
  undefined1 local_30 [8];
  ON_Interval path_domain;
  ON_LineCurve *line_curve_local;
  ON_Extrusion *this_local;
  
  path_domain.m_t[1] = (double)line_curve;
  bVar3 = ON_Line::IsValid(&this->m_path);
  if (bVar3) {
    uVar4 = PathParameter(this);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (this,(ulong)uVar4);
    bVar3 = ON_Interval::IsIncreasing((ON_Interval *)local_30);
    if (bVar3) {
      if (path_domain.m_t[1] == 0.0) {
        this_00 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(this_00);
        path_domain.m_t[1] = (double)this_00;
      }
      memcpy((void *)((long)path_domain.m_t[1] + 0x10),&this->m_path,0x30);
      dVar2 = path_domain.m_t[1];
      pdVar5 = ON_Interval::operator[]((ON_Interval *)local_30,0);
      dVar1 = *pdVar5;
      pdVar5 = ON_Interval::operator[]((ON_Interval *)local_30,1);
      (**(code **)(*(long *)dVar2 + 0x130))(dVar1,*pdVar5);
      this_local = (ON_Extrusion *)path_domain.m_t[1];
    }
    else {
      this_local = (ON_Extrusion *)0x0;
    }
  }
  else {
    this_local = (ON_Extrusion *)0x0;
  }
  return (ON_LineCurve *)this_local;
}

Assistant:

ON_LineCurve* ON_Extrusion::PathLineCurve(ON_LineCurve* line_curve) const
{
  if ( !m_path.IsValid() )
    return 0;

  ON_Interval path_domain = Domain(PathParameter());
  if ( !path_domain.IsIncreasing() )
    return 0;

  if ( 0 == line_curve )
    line_curve = new ON_LineCurve();
  line_curve->m_line = m_path;
  line_curve->SetDomain( path_domain[0], path_domain[1] );

  return line_curve;
}